

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

double __thiscall icu_63::FixedDecimal::getPluralOperand(FixedDecimal *this,PluralOperand operand)

{
  PluralOperand operand_local;
  FixedDecimal *this_local;
  
  switch(operand) {
  case PLURAL_OPERAND_N:
    this_local = (FixedDecimal *)this->source;
    break;
  case PLURAL_OPERAND_I:
    this_local = (FixedDecimal *)(double)this->intValue;
    break;
  case PLURAL_OPERAND_F:
    this_local = (FixedDecimal *)(double)this->decimalDigits;
    break;
  case PLURAL_OPERAND_T:
    this_local = (FixedDecimal *)(double)this->decimalDigitsWithoutTrailingZeros;
    break;
  case PLURAL_OPERAND_V:
    this_local = (FixedDecimal *)(double)this->visibleDecimalDigitCount;
    break;
  default:
    this_local = (FixedDecimal *)this->source;
  }
  return (double)this_local;
}

Assistant:

double FixedDecimal::getPluralOperand(PluralOperand operand) const {
    switch(operand) {
        case PLURAL_OPERAND_N: return source;
        case PLURAL_OPERAND_I: return static_cast<double>(intValue);
        case PLURAL_OPERAND_F: return static_cast<double>(decimalDigits);
        case PLURAL_OPERAND_T: return static_cast<double>(decimalDigitsWithoutTrailingZeros);
        case PLURAL_OPERAND_V: return visibleDecimalDigitCount;
        default:
             U_ASSERT(FALSE);  // unexpected.
             return source;
    }
}